

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O1

size_t duckdb_snappy::CompressFromIOVec
                 (iovec *iov,size_t iov_cnt,string *compressed,CompressionOptions options)

{
  ulong in_RAX;
  size_t *psVar1;
  pointer compressed_00;
  ulong uncompressed_length;
  size_t compressed_length;
  ulong local_38;
  
  if (iov_cnt == 0) {
    uncompressed_length = 0;
  }
  else {
    psVar1 = &iov->iov_len;
    uncompressed_length = 0;
    do {
      uncompressed_length = uncompressed_length + *psVar1;
      psVar1 = psVar1 + 2;
      iov_cnt = iov_cnt - 1;
    } while (iov_cnt != 0);
  }
  compressed_00 = (char *)0x0;
  local_38 = in_RAX;
  std::__cxx11::string::resize
            ((ulong)compressed,(char)uncompressed_length + (char)(uncompressed_length / 6) + ' ');
  if (compressed->_M_string_length != 0) {
    compressed_00 = (compressed->_M_dataplus)._M_p;
  }
  RawCompressFromIOVec(iov,uncompressed_length,compressed_00,&local_38,options);
  if (compressed->_M_string_length < local_38) {
    std::__throw_out_of_range_fmt
              ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
               local_38);
  }
  compressed->_M_string_length = local_38;
  (compressed->_M_dataplus)._M_p[local_38] = '\0';
  return local_38;
}

Assistant:

size_t CompressFromIOVec(const struct iovec* iov, size_t iov_cnt,
                         std::string* compressed, CompressionOptions options) {
  // Compute the number of bytes to be compressed.
  size_t uncompressed_length = 0;
  for (size_t i = 0; i < iov_cnt; ++i) {
    uncompressed_length += iov[i].iov_len;
  }

  // Pre-grow the buffer to the max length of the compressed output.
  STLStringResizeUninitialized(compressed, MaxCompressedLength(
      uncompressed_length));

  size_t compressed_length;
  RawCompressFromIOVec(iov, uncompressed_length, string_as_array(compressed),
                       &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}